

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O0

void amrex::sundials::MemoryHelper::Initialize(int nthreads)

{
  Long LVar1;
  int *piVar2;
  MemoryHelper **ppMVar3;
  int in_EDI;
  int i;
  vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
  *in_stack_ffffffffffffff98;
  MemoryHelper *in_stack_ffffffffffffffa0;
  __normal_iterator<amrex::sundials::MemoryHelper_**,_std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>_>
  in_stack_ffffffffffffffa8;
  __normal_iterator<amrex::sundials::MemoryHelper_**,_std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>_>
  in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  
  LVar1 = Vector<int,_std::allocator<int>_>::size((Vector<int,_std::allocator<int>_> *)0x284434);
  if (LVar1 == 0) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               in_stack_ffffffffffffffb8);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98);
    std::fill<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               in_stack_ffffffffffffffb0._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               in_stack_ffffffffffffffa8._M_current,(int *)in_stack_ffffffffffffffa0);
    std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>::
    resize((vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
            *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
           in_stack_ffffffffffffffb8);
    std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>::
    begin(in_stack_ffffffffffffff98);
    std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>::
    end(in_stack_ffffffffffffff98);
    std::
    fill<__gnu_cxx::__normal_iterator<amrex::sundials::MemoryHelper**,std::vector<amrex::sundials::MemoryHelper*,std::allocator<amrex::sundials::MemoryHelper*>>>,decltype(nullptr)>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               &in_stack_ffffffffffffffa0->sunctx);
  }
  for (iVar4 = 0; iVar4 < in_EDI; iVar4 = iVar4 + 1) {
    piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                        (size_type)in_stack_ffffffffffffff98);
    if (*piVar2 == 0) {
      piVar2 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                          (size_type)in_stack_ffffffffffffff98);
      *piVar2 = 1;
      in_stack_ffffffffffffffa0 = (MemoryHelper *)operator_new(0x10);
      The_Sundials_Context(0);
      MemoryHelper(in_stack_ffffffffffffffa0,(Context *)in_stack_ffffffffffffff98);
      ppMVar3 = Vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
                ::operator[]((Vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
                              *)in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      *ppMVar3 = in_stack_ffffffffffffffa0;
    }
  }
  return;
}

Assistant:

void MemoryHelper::Initialize(int nthreads)
{
    if (initialized.size() == 0) {
        initialized.resize(nthreads);
        std::fill(initialized.begin(), initialized.end(), 0);
        the_sunmemory_helper.resize(nthreads);
        std::fill(the_sunmemory_helper.begin(), the_sunmemory_helper.end(), nullptr);
    }
    for (int i = 0; i < nthreads; i++) {
        if (initialized[i]) continue;
        initialized[i] = 1;
        BL_ASSERT(the_sunmemory_helper[i] == nullptr);
        the_sunmemory_helper[i] = new MemoryHelper(The_Sundials_Context(i));
    }
}